

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Encode.cpp
# Opt level: O0

void idx2::CompressBufZstd(buffer *Input,bitstream *Output)

{
  long lVar1;
  size_t sVar2;
  size_t CpresSize;
  size_t MaxDstSize;
  bitstream *Output_local;
  buffer *Input_local;
  long local_88;
  i64 NewCapacity;
  i64 OriginalCapacity;
  undefined1 local_50 [8];
  buffer NewBuf;
  
  if (Input->Bytes != 0) {
    sVar2 = ZSTD_compressBound(Input->Bytes);
    lVar1 = (Output->Stream).Bytes;
    for (local_88 = lVar1;
        local_88 <=
        (long)(Output->BitPtr +
              (sVar2 - (long)(Output->BitPtr +
                             ((long)((Output->BitPos + 7) / 8) - (long)(Output->Stream).Data))) +
              ((long)((Output->BitPos + 7) / 8) - (long)(Output->Stream).Data) + 8);
        local_88 = (local_88 * 3) / 2 + 8) {
    }
    if ((lVar1 < local_88) &&
       (NewBuf.Alloc = (allocator *)(local_88 + 8), (Output->Stream).Bytes < (long)NewBuf.Alloc)) {
      NewBuf.Bytes = (i64)Mallocator();
      local_50 = (undefined1  [8])0x0;
      NewBuf.Data = (byte *)0x0;
      AllocBuf((buffer *)local_50,(i64)NewBuf.Alloc,(Output->Stream).Alloc);
      MemCopy(&Output->Stream,(buffer *)local_50,
              (u64)(Output->BitPtr +
                   ((long)((Output->BitPos + 7) / 8) - (long)(Output->Stream).Data)));
      Output->BitPtr =
           (byte *)((long)local_50 + ((long)Output->BitPtr - (long)(Output->Stream).Data));
      DeallocBuf(&Output->Stream);
      (Output->Stream).Data = (byte *)local_50;
      (Output->Stream).Bytes = (i64)NewBuf.Data;
      (Output->Stream).Alloc = (allocator *)NewBuf.Bytes;
    }
    sVar2 = ZSTD_compress((Output->Stream).Data,sVar2,Input->Data,Input->Bytes,1);
    if (sVar2 == 0) {
      fprintf(_stderr,"CompressBufZstd failed\n");
      exit(1);
    }
    Output->BitPtr = (Output->Stream).Data + sVar2;
  }
  return;
}

Assistant:

void
CompressBufZstd(const buffer& Input, bitstream* Output)
{
  if (Size(Input) == 0)
    return;
  size_t const MaxDstSize = ZSTD_compressBound(Size(Input));
  GrowToAccomodate(Output, MaxDstSize - Size(*Output));
  size_t const CpresSize =
    ZSTD_compress(Output->Stream.Data, MaxDstSize, Input.Data, Size(Input), 1);
  if (CpresSize <= 0)
  {
    fprintf(stderr, "CompressBufZstd failed\n");
    exit(1);
  }
  Output->BitPtr = CpresSize + Output->Stream.Data;
}